

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O2

void Cec_ManPatPrintStats(Cec_ManPat_t *p)

{
  ulong Time;
  abctime time;
  Cec_ManPat_t *pCVar1;
  
  pCVar1 = p;
  Abc_Print((int)p,"Latest: P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n",
            (double)p->nPatLitsMin / (double)p->nPats,
            (double)(p->vStorage->nSize - p->iStart) * 9.5367431640625e-07,(ulong)(uint)p->nPats,
            (ulong)(uint)p->nPatLits);
  Time = (ulong)(uint)p->nPatLitsAll;
  Abc_Print((int)pCVar1,"Total:  P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n",
            (double)p->nPatLitsMinAll / (double)p->nPatsAll,
            (double)p->vStorage->nSize * 9.5367431640625e-07);
  Abc_PrintTimeP(0x83c9d3,(char *)p->timeFind,p->timeTotal,Time);
  Abc_PrintTimeP(0x83c9dd,(char *)p->timeShrink,p->timeTotal,Time);
  Abc_PrintTimeP(0x83c9e7,(char *)p->timeVerify,p->timeTotal,Time);
  Abc_PrintTimeP(0x83c9f1,(char *)p->timeSort,p->timeTotal,Time);
  Abc_PrintTimeP(0x83c9fb,(char *)p->timePack,p->timeTotal,Time);
  Abc_PrintTime(0x8318d4,(char *)p->timeTotal,time);
  return;
}

Assistant:

void Cec_ManPatPrintStats( Cec_ManPat_t * p )  
{ 
    Abc_Print( 1, "Latest: P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n", 
        p->nPats, p->nPatLits, p->nPatLitsMin, 1.0 * p->nPatLitsMin/p->nPats, 
        1.0*(Vec_StrSize(p->vStorage)-p->iStart)/(1<<20) );
    Abc_Print( 1, "Total:  P = %8d.  L = %10d.  Lm = %10d. Ave = %6.1f. MEM =%6.2f MB\n", 
        p->nPatsAll, p->nPatLitsAll, p->nPatLitsMinAll, 1.0 * p->nPatLitsMinAll/p->nPatsAll, 
        1.0*Vec_StrSize(p->vStorage)/(1<<20) );
    Abc_PrintTimeP( 1, "Finding  ", p->timeFind,   p->timeTotal );
    Abc_PrintTimeP( 1, "Shrinking", p->timeShrink, p->timeTotal );
    Abc_PrintTimeP( 1, "Verifying", p->timeVerify, p->timeTotal );
    Abc_PrintTimeP( 1, "Sorting  ", p->timeSort,   p->timeTotal );
    Abc_PrintTimeP( 1, "Packing  ", p->timePack,   p->timeTotal );
    Abc_PrintTime( 1, "TOTAL    ",  p->timeTotal );
}